

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall QMenuPrivate::hideMenu(QMenuPrivate *this,QMenu *menu)

{
  QAction *pQVar1;
  QAction *pQVar2;
  Data *pDVar3;
  long lVar4;
  int *piVar5;
  bool bVar6;
  int iVar7;
  int *piVar8;
  QStyle *pQVar9;
  QObject *pQVar10;
  QMenu *pQVar11;
  QAction *pQVar12;
  uint uVar13;
  QAction *pQVar14;
  long in_FS_OFFSET;
  bool bVar15;
  undefined1 *local_88;
  undefined1 *puStack_80;
  QList<QAction_*> local_70;
  undefined1 local_58 [16];
  QMenu *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (menu == (QMenu *)0x0) goto LAB_0045e495;
  piVar8 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)menu);
  uVar13 = *(uint *)(*(long *)&(menu->super_QWidget).field_0x8 + 0x30);
  QObject::blockSignals(SUB81(menu,0));
  this->field_0x421 = this->field_0x421 | 1;
  pQVar9 = QWidget::style(&menu->super_QWidget);
  if (piVar8 == (int *)0x0) {
    pQVar11 = (QMenu *)0x0;
  }
  else {
    pQVar11 = (QMenu *)0x0;
    if (piVar8[1] != 0) {
      pQVar11 = menu;
    }
  }
  iVar7 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x51,0,pQVar11);
  if ((iVar7 == 0) || (this->currentAction == (QAction *)0x0)) {
LAB_0045e2a6:
    bVar6 = false;
    bVar15 = false;
  }
  else {
    pDVar3 = (this->actionAboutToTrigger).wp.d;
    if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
      pQVar12 = (QAction *)0x0;
    }
    else {
      pQVar12 = (QAction *)(this->actionAboutToTrigger).wp.value;
    }
    if (pQVar12 != this->currentAction) goto LAB_0045e2a6;
    QWidget::actions(&local_70,&menu->super_QWidget);
    if (local_70.d.size == 0) {
LAB_0045e50e:
      pQVar12 = (QAction *)0xffffffffffffffff;
    }
    else {
      pQVar14 = (QAction *)0xfffffffffffffff8;
      do {
        pQVar1 = pQVar14 + local_70.d.size * -8;
        if (pQVar1 == (QAction *)0xfffffffffffffff8) goto LAB_0045e508;
        pQVar12 = pQVar14 + 8;
        pQVar2 = (QAction *)((long)(local_70.d.ptr + 1) + (long)pQVar14);
        pQVar14 = pQVar12;
      } while (*(QAction **)pQVar2 != this->currentAction);
      pQVar12 = (QAction *)((long)pQVar12 >> 3);
LAB_0045e508:
      if (pQVar1 == (QAction *)0xfffffffffffffff8) goto LAB_0045e50e;
    }
    bVar15 = pQVar12 != (QAction *)0xffffffffffffffff;
    bVar6 = true;
  }
  if ((bVar6) && (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (bVar15) {
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    QEventLoop::QEventLoop((QEventLoop *)&local_88,(QObject *)0x0);
    pQVar12 = this->currentAction;
    setCurrentAction(*(QMenuPrivate **)&(menu->super_QWidget).field_0x8,(QAction *)0x0,0,
                     SelectedFromElsewhere,false);
    local_48 = (QMenu *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QObject::QObject((QObject *)local_58,(QObject *)0x0);
    local_58._0_8_ = &PTR_metaObject_00805558;
    puStack_40 = (undefined1 *)((ulong)puStack_40 & 0xffffffffffffff00);
    local_48 = menu;
    QObject::installEventFilter((QObject *)menu);
    QTimer::singleShot(60000000,0,(QEventLoop *)&local_88,"1quit()");
    QEventLoop::exec((QEventLoop *)&local_88,0);
    if ((piVar8 != (int *)0x0) && (piVar8[1] != 0)) {
      QMenu::setActiveAction(menu,pQVar12);
      QTimer::singleShot(20000000,0,(QEventLoop *)&local_88,"1quit()");
      QEventLoop::exec((QEventLoop *)&local_88,0);
      hideMenu::Reposter::~Reposter((Reposter *)local_58);
      QEventLoop::~QEventLoop((QEventLoop *)&local_88);
      goto LAB_0045e3cb;
    }
    hideMenu::Reposter::~Reposter((Reposter *)local_58);
    QEventLoop::~QEventLoop((QEventLoop *)&local_88);
  }
  else {
LAB_0045e3cb:
    this->field_0x421 = this->field_0x421 & 0xfe;
    if (piVar8 == (int *)0x0) goto LAB_0045e495;
    if (piVar8[1] != 0) {
      uVar13 = (uVar13 & 2) >> 1;
      QObject::blockSignals(SUB81(menu,0));
      pDVar3 = (this->activeMenu).wp.d;
      if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
        pQVar10 = (QObject *)0x0;
      }
      else {
        pQVar10 = (this->activeMenu).wp.value;
      }
      if (pQVar10 == (QObject *)menu) {
        (this->activeMenu).wp.d = (Data *)0x0;
        (this->activeMenu).wp.value = (QObject *)0x0;
        if (pDVar3 != (Data *)0x0) {
          LOCK();
          *(int *)pDVar3 = *(int *)pDVar3 + -1;
          UNLOCK();
          if (*(int *)pDVar3 == 0) {
            operator_delete(pDVar3);
          }
        }
      }
      lVar4 = *(long *)&(menu->super_QWidget).field_0x8;
      piVar5 = *(int **)(lVar4 + 0x308);
      *(undefined8 *)(lVar4 + 0x308) = 0;
      *(undefined8 *)(lVar4 + 0x310) = 0;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          operator_delete(piVar5);
        }
      }
      QWidget::close(&menu->super_QWidget,uVar13);
      lVar4 = *(long *)&(menu->super_QWidget).field_0x8;
      piVar5 = *(int **)(lVar4 + 0x2f8);
      *(undefined8 *)(lVar4 + 0x2f8) = 0;
      *(undefined8 *)(lVar4 + 0x300) = 0;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          operator_delete(piVar5);
        }
      }
    }
  }
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      operator_delete(piVar8);
    }
  }
LAB_0045e495:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::hideMenu(QMenu *menu)
{
    if (!menu)
        return;

    // See two execs below. They may trigger an akward situation
    // when 'menu' (also known as 'q' or 'this' in the many functions
    // around) to become a dangling pointer if the loop manages
    // to execute 'deferred delete' ... posted while executing
    // this same loop. Not good!
    struct Reposter : QObject
    {
        Reposter(QMenu *menu) : q(menu)
        {
            Q_ASSERT(q);
            q->installEventFilter(this);
        }
        ~Reposter()
        {
            if (deleteLater)
                q->deleteLater();
        }
        bool eventFilter(QObject *obj, QEvent *event) override
        {
            if (obj == q && event->type() == QEvent::DeferredDelete)
                return deleteLater = true;

            return QObject::eventFilter(obj, event);
        }
        QMenu *q = nullptr;
        bool deleteLater = false;
    };

#if QT_CONFIG(effects)
    // If deleteLater has been called and the event loop spins, while waiting
    // for visual effects to happen, menu might become stale.
    // To prevent a QSignalBlocker from restoring a stale object, block and restore signals manually.
    QPointer<QMenu> stillAlive(menu);
    const bool signalsBlocked = menu->signalsBlocked();
    menu->blockSignals(true);

    aboutToHide = true;
    // Flash item which is about to trigger (if any).
    if (menu && menu->style()->styleHint(QStyle::SH_Menu_FlashTriggeredItem, nullptr, stillAlive)
        && currentAction && currentAction == actionAboutToTrigger
        && menu->actions().contains(currentAction)) {
        QEventLoop eventLoop;
        QAction *activeAction = currentAction;

        menu->setActiveAction(nullptr);
        const Reposter deleteDeleteLate(menu);
        QTimer::singleShot(60, &eventLoop, SLOT(quit()));
        eventLoop.exec();

        if (!stillAlive)
            return;

        // Select and wait 20 ms.
        menu->setActiveAction(activeAction);
        QTimer::singleShot(20, &eventLoop, SLOT(quit()));
        eventLoop.exec();
    }

    aboutToHide = false;

    if (stillAlive)
        menu->blockSignals(signalsBlocked);
    else
        return;

#endif // QT_CONFIG(effects)
    if (activeMenu == menu)
        activeMenu = nullptr;

    menu->d_func()->causedPopup.action = nullptr;
    menu->close();
    menu->d_func()->causedPopup.widget = nullptr;
}